

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::SolverParameter::Clear(SolverParameter *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  NetParameter *pNVar4;
  NetState *this_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->test_net_).super_RepeatedPtrFieldBase);
  (this->test_iter_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetParameter>::TypeHandler>
            (&(this->test_net_param_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
            (&(this->test_state_).super_RepeatedPtrFieldBase);
  (this->stepvalue_).current_size_ = 0;
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->train_net_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b83);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !train_net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->train_net_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = (this->lr_policy_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b87);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !lr_policy_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->lr_policy_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 4) != 0) {
      psVar3 = (this->snapshot_prefix_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b8b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !snapshot_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->snapshot_prefix_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 8) != 0) {
      psVar3 = (this->net_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b8f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->net_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x10) != 0) {
      psVar3 = (this->regularization_type_).ptr_;
      if (psVar3 == (string *)&_default_regularization_type__abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b93);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !regularization_type_.IsDefault(&SolverParameter::_default_regularization_type_.get()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->regularization_type_).ptr_;
      }
      std::__cxx11::string::_M_assign((string *)psVar3);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x20) != 0) {
      psVar3 = (this->type_).ptr_;
      if (psVar3 == (string *)&_default_type__abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b97);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !type_.IsDefault(&SolverParameter::_default_type_.get()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        psVar3 = (this->type_).ptr_;
      }
      std::__cxx11::string::_M_assign((string *)psVar3);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x40) != 0) {
      pNVar4 = this->train_net_param_;
      if (pNVar4 == (NetParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b9b);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: train_net_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pNVar4 = this->train_net_param_;
      }
      NetParameter::Clear(pNVar4);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((char)uVar1 < '\0') {
      pNVar4 = this->net_param_;
      if (pNVar4 == (NetParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b9f);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,"CHECK failed: net_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
        pNVar4 = this->net_param_;
      }
      NetParameter::Clear(pNVar4);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 >> 8 & 1) != 0) {
    this_00 = this->train_state_;
    if (this_00 == (NetState *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x1ba4);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: train_state_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_50);
      this_00 = this->train_state_;
    }
    NetState::Clear(this_00);
    uVar1 = (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0xfe00) != 0) {
    this->max_iter_ = 0;
    this->gamma_ = 0.0;
    this->power_ = 0.0;
    this->momentum_ = 0.0;
    this->test_interval_ = 0;
    this->base_lr_ = 0.0;
    this->display_ = 0;
    this->max_iter_ = 0;
  }
  if ((uVar1 & 0xff0000) != 0) {
    this->weight_decay_ = 0.0;
    this->stepsize_ = 0;
    this->snapshot_ = 0;
    this->device_id_ = 0;
    this->test_compute_loss_ = false;
    this->snapshot_diff_ = false;
    this->debug_info_ = false;
    this->field_0xf7 = 0;
    this->solver_type_ = 0;
  }
  if (0xffffff < uVar1) {
    this->momentum2_ = 0.999;
    this->random_seed_ = -1;
    this->solver_mode_ = 1;
    this->test_initialization_ = true;
    this->snapshot_after_train_ = true;
    this->delta_ = 1e-08;
    this->average_loss_ = 1;
    this->clip_gradients_ = -1.0;
  }
  if (((this->_has_bits_).has_bits_[1] & 7) != 0) {
    this->iter_size_ = 1;
    this->snapshot_format_ = 1;
    this->rms_decay_ = 0.99;
  }
  *(undefined8 *)(this->_has_bits_).has_bits_ = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void SolverParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.SolverParameter)
  test_net_.Clear();
  test_iter_.Clear();
  test_net_param_.Clear();
  test_state_.Clear();
  stepvalue_.Clear();
  if (_has_bits_[0 / 32] & 255u) {
    if (has_train_net()) {
      GOOGLE_DCHECK(!train_net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*train_net_.UnsafeRawStringPointer())->clear();
    }
    if (has_lr_policy()) {
      GOOGLE_DCHECK(!lr_policy_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*lr_policy_.UnsafeRawStringPointer())->clear();
    }
    if (has_snapshot_prefix()) {
      GOOGLE_DCHECK(!snapshot_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*snapshot_prefix_.UnsafeRawStringPointer())->clear();
    }
    if (has_net()) {
      GOOGLE_DCHECK(!net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*net_.UnsafeRawStringPointer())->clear();
    }
    if (has_regularization_type()) {
      GOOGLE_DCHECK(!regularization_type_.IsDefault(&SolverParameter::_default_regularization_type_.get()));
      (*regularization_type_.UnsafeRawStringPointer())->assign(*&SolverParameter::_default_regularization_type_.get());
    }
    if (has_type()) {
      GOOGLE_DCHECK(!type_.IsDefault(&SolverParameter::_default_type_.get()));
      (*type_.UnsafeRawStringPointer())->assign(*&SolverParameter::_default_type_.get());
    }
    if (has_train_net_param()) {
      GOOGLE_DCHECK(train_net_param_ != NULL);
      train_net_param_->::caffe::NetParameter::Clear();
    }
    if (has_net_param()) {
      GOOGLE_DCHECK(net_param_ != NULL);
      net_param_->::caffe::NetParameter::Clear();
    }
  }
  if (has_train_state()) {
    GOOGLE_DCHECK(train_state_ != NULL);
    train_state_->::caffe::NetState::Clear();
  }
  if (_has_bits_[8 / 32] & 65024u) {
    ::memset(&test_interval_, 0, reinterpret_cast<char*>(&momentum_) -
      reinterpret_cast<char*>(&test_interval_) + sizeof(momentum_));
  }
  if (_has_bits_[16 / 32] & 16711680u) {
    ::memset(&weight_decay_, 0, reinterpret_cast<char*>(&solver_type_) -
      reinterpret_cast<char*>(&weight_decay_) + sizeof(solver_type_));
  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    momentum2_ = 0.999f;
    random_seed_ = GOOGLE_LONGLONG(-1);
    solver_mode_ = 1;
    test_initialization_ = true;
    snapshot_after_train_ = true;
    delta_ = 1e-08f;
    average_loss_ = 1;
    clip_gradients_ = -1;
  }
  if (_has_bits_[32 / 32] & 7u) {
    iter_size_ = 1;
    snapshot_format_ = 1;
    rms_decay_ = 0.99f;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}